

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O1

bool __thiscall clickhouse::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64_t *value)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  byte unaff_BPL;
  long lVar3;
  uint8_t byte;
  byte local_29;
  
  *value = 0;
  lVar3 = 0;
  do {
    iVar2 = (*(this->input_->super_InputStream)._vptr_InputStream[2])(this->input_,&local_29,1);
    if (CONCAT44(extraout_var,iVar2) == 1) {
      *value = *value | (ulong)(local_29 & 0x7f) << ((byte)lVar3 & 0x3f);
      unaff_BPL = -1 < (char)local_29 | unaff_BPL;
      bVar1 = local_29 >> 7;
    }
    else {
      unaff_BPL = 0;
      bVar1 = 0;
    }
    if (bVar1 == 0) goto LAB_0013321c;
    lVar3 = lVar3 + 7;
  } while (lVar3 != 0x46);
  unaff_BPL = 0;
LAB_0013321c:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool CodedInputStream::ReadVarint64(uint64_t* value) {
    *value = 0;

    for (size_t i = 0; i < MAX_VARINT_BYTES; ++i) {
        uint8_t byte;

        if (!input_->ReadByte(&byte)) {
            return false;
        } else {
            *value |= uint64_t(byte & 0x7F) << (7 * i);

            if (!(byte & 0x80)) {
                return true;
            }
        }
    }

    // TODO skip invalid
    return false;
}